

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O3

int __thiscall Function::copy(Function *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  Function *pFVar2;
  undefined8 uVar3;
  double dVar4;
  
  this->eType = *(FunctionType *)(dst + 0x9c);
  pFVar2 = *(Function **)(dst + 0xa8);
  this->xLeft = pFVar2;
  if (pFVar2 != (Function *)0x0) {
    pFVar2->functionUseCount = pFVar2->functionUseCount + 1;
  }
  pFVar2 = *(Function **)(dst + 0xb0);
  this->xRight = pFVar2;
  if (pFVar2 != (Function *)0x0) {
    pFVar2->functionUseCount = pFVar2->functionUseCount + 1;
  }
  pFVar2 = *(Function **)(dst + 0xb8);
  this->xPlus = pFVar2;
  if (pFVar2 != (Function *)0x0) {
    pFVar2->functionUseCount = pFVar2->functionUseCount + 1;
  }
  this->xTable = *(Matrix **)(dst + 0xc0);
  this->xSrc = *(double **)(dst + 0xa0);
  uVar3 = *(undefined8 *)(dst + 0xd0);
  this->xFunction = *(offset_in_Function_to_subr *)(dst + 200);
  *(undefined8 *)&this->field_0xd0 = uVar3;
  dVar4 = *(double *)(dst + 0xf0);
  this->dValue = *(double *)(dst + 0xe8);
  this->dLastValue = dVar4;
  dVar4 = *(double *)(dst + 0x128);
  this->dXMin = *(double *)(dst + 0x120);
  this->dXMax = dVar4;
  dVar4 = *(double *)(dst + 0x138);
  this->dXStep = *(double *)(dst + 0x130);
  this->dYMin = dVar4;
  dVar4 = *(double *)(dst + 0x148);
  this->dYMax = *(double *)(dst + 0x140);
  this->dYStep = dVar4;
  dVar4 = *(double *)(dst + 0x108);
  this->dXInput = *(double *)(dst + 0x100);
  this->dNextXInput = dVar4;
  dVar4 = *(double *)(dst + 0x118);
  this->dYInput = *(double *)(dst + 0x110);
  this->dNextYInput = dVar4;
  this->bValueValid = (bool)dst[0xf8];
  this->bVerbose = (bool)dst[0xd8];
  std::__cxx11::string::_M_assign((string *)&this->sName);
  iVar1 = *(int *)(dst + 0x98);
  this->functionUseCount = iVar1;
  return iVar1;
}

Assistant:

void Function::copy(const Function &f)
{
	eType = f.eType;
	xLeft = f.xLeft;
	if (xLeft)
		xLeft->functionUseCount++;
	xRight = f.xRight;
	if (xRight)
		xRight->functionUseCount++;
	xPlus = f.xPlus;
	if (xPlus)
		xPlus->functionUseCount++;
	xTable = f.xTable;
	xSrc = f.xSrc;
	xFunction = f.xFunction;
	dValue = f.dValue;
	dLastValue = f.dLastValue;
	dXMin = f.dXMin;
	dXMax = f.dXMax;
	dXStep = f.dXStep;
	dYMin = f.dYMin;
	dYMax = f.dYMax;
	dYStep = f.dYStep;
	dXInput = f.dXInput;
	dNextXInput = f.dNextXInput;
	dYInput = f.dYInput;
	dNextYInput = f.dNextYInput;
	bValueValid = f.bValueValid;
	bVerbose = f.bVerbose;
	sName = f.sName;
	functionUseCount = f.functionUseCount;
}